

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O1

TPZAutoPointer<TPZRefPattern> * __thiscall
TPZAutoPointer<TPZRefPattern>::operator=
          (TPZAutoPointer<TPZRefPattern> *this,TPZAutoPointer<TPZRefPattern> *rval)

{
  TPZReference *this_00;
  bool bVar1;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      if (((this->fRef != (TPZReference *)0x0) &&
          ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) &&
         (this_00 = this->fRef, this_00 != (TPZReference *)0x0)) {
        TPZReference::~TPZReference(this_00);
        operator_delete(this_00,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  this->fRef = rval->fRef;
  rval->fRef = (TPZReference *)0x0;
  return this;
}

Assistant:

TPZAutoPointer &operator=(TPZAutoPointer<T> &&rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = rval.fRef;
        rval.fRef = nullptr;
        return *this;
    }